

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_GenericField64.c
# Opt level: O1

void Hacl_GenericField64_exp_vartime
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,uint64_t *aM,uint32_t bBits,
               uint64_t *b,uint64_t *resM)

{
  uint64_t *puVar1;
  size_t __n;
  size_t sVar2;
  long lVar3;
  uint64_t *__n_00;
  uint uVar4;
  int iVar5;
  byte bVar6;
  sbyte sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint64_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint64_t *puVar16;
  uint uVar17;
  uint64_t *puVar18;
  uint64_t uStack_e0;
  ulong local_d8 [3];
  uint64_t *local_c0;
  uint64_t *t11_3;
  uint64_t *t11_2;
  uint64_t *t11_1;
  ulong local_a0;
  uint64_t *local_98;
  uint64_t *ctx_r2;
  ulong local_88;
  uint64_t *local_80;
  uint64_t *t11;
  uint local_6c;
  uint64_t *local_68;
  ulong local_60;
  uint64_t *local_58;
  uint64_t *ctx_n;
  uint64_t *local_48;
  uint64_t local_40;
  uint64_t *local_38;
  uint64_t *ctx_n0;
  
  uVar17 = k->len;
  uVar8 = (ulong)uVar17;
  ctx_n = k->n;
  local_40 = k->mu;
  local_38 = k->r2;
  uVar9 = uVar8 * 8 + 0xf & 0xfffffffffffffff0;
  lVar3 = -uVar9;
  puVar16 = (uint64_t *)((long)local_d8 + lVar3);
  __n = uVar8 * 8;
  ctx_r2 = b;
  local_68 = resM;
  local_58 = aM;
  *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x19c7fa;
  memset(puVar16,0,__n);
  puVar11 = local_58;
  local_48 = puVar16;
  *(undefined8 *)((long)&uStack_e0 + lVar3) = 0x19c80d;
  memcpy(puVar16,puVar11,__n);
  local_a0 = (ulong)bBits;
  if (bBits < 200) {
    puVar16 = puVar16 + -(ulong)(uVar17 * 2);
    uVar9 = 0;
    puVar16[-1] = 0x19c842;
    memset(puVar16,0,(ulong)(uVar17 * 2) * 8);
    puVar11 = ctx_n;
    puVar16[-1] = 0x19c851;
    memcpy(puVar16,puVar11,__n);
    puVar11 = local_38;
    puVar16[-1] = 0x19c864;
    memcpy(puVar16 + uVar8,puVar11,__n);
    uVar13 = local_40;
    puVar11 = local_68;
    local_38 = puVar16;
    puVar16[-1] = 0x19c881;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar17,puVar16,uVar13,puVar16 + uVar8,puVar11);
    puVar11 = local_38;
    uVar4 = (uint)local_a0;
    if (uVar4 != 0) {
      do {
        puVar12 = local_48;
        puVar1 = local_68;
        if ((ctx_r2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
          puVar16[-1] = 0x19c8ce;
          Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar11,uVar13,puVar1,puVar12,puVar1);
        }
        puVar1 = local_48;
        puVar16[-1] = 0x19c8e3;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar11,uVar13,puVar1,puVar1);
        uVar14 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar14;
      } while (uVar4 != uVar14);
    }
  }
  else {
    local_6c = bBits - 1 >> 6;
    local_60 = (ulong)(uVar17 * 2);
    sVar2 = local_60 * 8;
    puVar16 = puVar16 + -local_60;
    local_58 = puVar16;
    puVar16[-1] = 0x19c924;
    memset(puVar16,0,sVar2);
    puVar11 = ctx_n;
    puVar16[-1] = 0x19c933;
    memcpy(puVar16,puVar11,__n);
    puVar11 = local_38;
    local_98 = puVar16 + uVar8;
    puVar16[-1] = 0x19c94a;
    memcpy(puVar16 + uVar8,puVar11,__n);
    local_d8[0] = (ulong)(uVar17 << 4);
    sVar2 = local_d8[0] * 8;
    puVar16 = puVar16 + -local_d8[0];
    puVar16[-1] = 0x19c975;
    memset(puVar16,0,sVar2);
    puVar18 = (uint64_t *)((long)puVar16 - uVar9);
    local_88 = uVar9;
    puVar18[-1] = 0x19c98f;
    memset(puVar18,0,__n);
    uVar13 = local_40;
    puVar1 = local_58;
    puVar11 = local_98;
    ctx_n = puVar16;
    local_38 = (uint64_t *)__n;
    puVar18[-1] = 0x19c9bb;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar17,puVar1,uVar13,puVar11,puVar16);
    puVar12 = local_38;
    puVar11 = local_48;
    puVar18[-1] = 0x19c9cb;
    memcpy(puVar16 + uVar8,puVar11,(size_t)puVar12);
    uVar13 = local_40;
    puVar18[-1] = 0x19c9e3;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar16 + uVar8,puVar18);
    puVar11 = local_38;
    puVar16 = puVar16 + local_60;
    puVar18[-1] = 0x19ca01;
    memcpy(puVar16,puVar18,(size_t)puVar11);
    puVar11 = local_48;
    puVar1 = local_58;
    puVar18[-1] = 0x19ca1d;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar11,puVar16,puVar18);
    puVar12 = local_38;
    local_d8[1] = (ulong)(uVar17 * 3);
    puVar11 = ctx_n + local_d8[1];
    local_80 = puVar11;
    puVar18[-1] = 0x19ca40;
    memcpy(puVar11,puVar18,(size_t)puVar12);
    puVar18[-1] = 0x19ca54;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar16,puVar18);
    puVar16 = local_38;
    local_d8[2] = (ulong)(uVar17 * 4);
    puVar11 = ctx_n + local_d8[2];
    t11_2 = puVar11;
    puVar18[-1] = 0x19ca81;
    memcpy(puVar11,puVar18,(size_t)puVar16);
    uVar13 = local_40;
    puVar16 = local_48;
    puVar18[-1] = 0x19caa0;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar16,puVar11,puVar18);
    puVar12 = local_38;
    puVar16 = ctx_n;
    t11 = (uint64_t *)(ulong)(uVar17 * 5);
    puVar11 = ctx_n + (long)t11;
    t11_3 = puVar11;
    puVar18[-1] = 0x19cac3;
    memcpy(puVar11,puVar18,(size_t)puVar12);
    puVar11 = local_80;
    puVar18[-1] = 0x19cad8;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar11,puVar18);
    puVar11 = local_38;
    puVar16 = puVar16 + (uint)((int)local_60 * 3);
    local_c0 = puVar16;
    puVar18[-1] = 0x19caf9;
    memcpy(puVar16,puVar18,(size_t)puVar11);
    uVar13 = local_40;
    puVar11 = local_48;
    puVar18[-1] = 0x19cb15;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar11,puVar16,puVar18);
    puVar11 = local_38;
    puVar16 = ctx_n;
    t11_1 = (uint64_t *)(ulong)(uVar17 * 8);
    puVar12 = ctx_n + uVar17 * 7;
    local_80 = puVar12;
    puVar18[-1] = 0x19cb46;
    memcpy(puVar12,puVar18,(size_t)puVar11);
    puVar11 = t11_2;
    puVar18[-1] = 0x19cb5e;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar11,puVar18);
    puVar12 = local_38;
    puVar11 = puVar16 + (long)t11_1;
    puVar18[-1] = 0x19cb7c;
    memcpy(puVar11,puVar18,(size_t)puVar12);
    uVar13 = local_40;
    puVar12 = local_48;
    puVar18[-1] = 0x19cb95;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar12,puVar11,puVar18);
    puVar11 = local_38;
    puVar18[-1] = 0x19cba9;
    memcpy(puVar16 + uVar17 * 9,puVar18,(size_t)puVar11);
    uVar13 = local_40;
    puVar11 = t11_3;
    puVar18[-1] = 0x19cbc2;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar11,puVar18);
    puVar11 = local_38;
    iVar5 = (int)local_60;
    puVar18[-1] = 0x19cbdc;
    memcpy(puVar16 + (uint)(iVar5 * 5),puVar18,(size_t)puVar11);
    uVar13 = local_40;
    puVar11 = local_48;
    puVar18[-1] = 0x19cbf8;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64
              (uVar17,puVar1,uVar13,puVar11,puVar16 + (uint)(iVar5 * 5),puVar18);
    puVar11 = local_38;
    iVar5 = (int)t11;
    puVar18[-1] = 0x19cc10;
    memcpy(puVar16 + (uVar17 + iVar5 * 2),puVar18,(size_t)puVar11);
    puVar16 = local_58;
    puVar11 = local_c0;
    puVar18[-1] = 0x19cc2c;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar16,uVar13,puVar11,puVar18);
    puVar16 = local_38;
    puVar11 = ctx_n + (uint)((int)local_d8[2] * 3);
    puVar18[-1] = 0x19cc4d;
    memcpy(puVar11,puVar18,(size_t)puVar16);
    puVar16 = local_48;
    puVar1 = local_58;
    puVar18[-1] = 0x19cc69;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar16,puVar11,puVar18);
    puVar12 = local_38;
    puVar16 = ctx_n;
    puVar11 = ctx_n + (uVar17 + (int)local_d8[1] * 4);
    puVar18[-1] = 0x19cc88;
    memcpy(puVar11,puVar18,(size_t)puVar12);
    uVar13 = local_40;
    puVar11 = local_80;
    puVar18[-1] = 0x19cc9e;
    Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar17,puVar1,uVar13,puVar11,puVar18);
    puVar12 = local_38;
    puVar11 = puVar16 + (uint)((int)local_d8[0] - (int)local_60);
    puVar18[-1] = 0x19ccbb;
    memcpy(puVar11,puVar18,(size_t)puVar12);
    __n_00 = local_38;
    uVar13 = local_40;
    puVar12 = local_48;
    puVar18[-1] = 0x19ccd8;
    Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar17,puVar1,uVar13,puVar12,puVar11,puVar18);
    uVar9 = local_a0;
    iVar5 = (int)t11;
    puVar18[-1] = 0x19ccf5;
    memcpy(puVar16 + (uint)(iVar5 * 3),puVar18,(size_t)__n_00);
    uVar13 = local_40;
    puVar16 = local_68;
    uVar10 = local_88;
    puVar11 = local_98;
    local_60 = uVar8;
    if ((uVar9 & 3) == 0) {
      puVar18[-1] = 0x19cd77;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(uVar17,puVar1,uVar13,puVar11,puVar16);
      uVar10 = local_88;
    }
    else {
      uVar8 = uVar9 >> 6 & 0x3ffffff;
      bVar6 = (byte)uVar9 & 0x3c;
      uVar4 = (uint)(ctx_r2[uVar8] >> bVar6);
      if ((uVar9 & 0x3c) != 0 && (uint)uVar8 < local_6c) {
        uVar4 = uVar4 | (uint)(ctx_r2[uVar8 + 1] << (-bVar6 & 0x3f));
      }
      puVar11 = ctx_n + (uVar4 & 0xf) * uVar17;
      puVar18[-1] = 0x19cd5f;
      memcpy(puVar16,puVar11,(size_t)__n_00);
    }
    puVar18 = (uint64_t *)((long)puVar18 - uVar10);
    t11 = puVar18;
    puVar18[-1] = 0x19cd95;
    memset(puVar18,0,(size_t)__n_00);
    uVar17 = (uint)uVar9 & 0xfffffffc;
    iVar5 = ((uint)(uVar9 >> 2) & 0x3fffffff) + (uint)((uVar9 >> 2 & 0x3fffffff) == 0);
    puVar11 = local_58;
    uVar13 = local_40;
    uVar9 = local_60;
    do {
      puVar16 = local_68;
      uVar17 = uVar17 - 4;
      local_48 = (uint64_t *)CONCAT44(local_48._4_4_,iVar5);
      uVar15 = (uint32_t)uVar9;
      puVar18[-1] = 0x19cdd0;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar15,puVar11,uVar13,puVar16,puVar16);
      puVar18[-1] = 0x19cde4;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar15,puVar11,uVar13,puVar16,puVar16);
      puVar18[-1] = 0x19cdf8;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar15,puVar11,uVar13,puVar16,puVar16);
      puVar18[-1] = 0x19ce0c;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(uVar15,puVar11,uVar13,puVar16,puVar16);
      puVar11 = local_38;
      uVar9 = local_60;
      puVar16 = t11;
      uVar14 = uVar17 >> 6;
      sVar7 = (sbyte)(uVar17 & 0x3c);
      uVar4 = (uint)(ctx_r2[uVar14] >> sVar7);
      if ((uVar17 & 0x3c) != 0 && uVar14 < local_6c) {
        uVar4 = uVar4 | (uint)(ctx_r2[(ulong)uVar14 + 1] << (-sVar7 & 0x3fU));
      }
      uVar15 = (uint32_t)local_60;
      puVar1 = ctx_n + (uVar4 & 0xf) * uVar15;
      puVar18[-1] = 0x19ce6a;
      memcpy(puVar16,puVar1,(size_t)puVar11);
      uVar13 = local_40;
      puVar11 = local_58;
      puVar1 = local_68;
      puVar18[-1] = 0x19ce8a;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(uVar15,puVar11,uVar13,puVar1,puVar16,puVar1);
      iVar5 = (int)local_48 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void
Hacl_GenericField64_exp_vartime(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 *k,
  uint64_t *aM,
  uint32_t bBits,
  uint64_t *b,
  uint64_t *resM
)
{
  uint32_t len1 = Hacl_GenericField64_field_get_len(k);
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u64 k1 = *k;
  KRML_CHECK_SIZE(sizeof (uint64_t), k1.len);
  uint64_t aMc[k1.len];
  memset(aMc, 0U, k1.len * sizeof (uint64_t));
  memcpy(aMc, aM, k1.len * sizeof (uint64_t));
  if (bBits < 200U)
  {
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    uint64_t *ctx_n = ctx;
    uint64_t *ctx_r2 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    for (uint32_t i = 0U; i < bBits; i++)
    {
      uint32_t i1 = i / 64U;
      uint32_t j = i % 64U;
      uint64_t tmp = b[i1];
      uint64_t bit = tmp >> j & 1ULL;
      if (!(bit == 0ULL))
      {
        uint64_t *ctx_n0 = ctx;
        Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n0, k1.mu, resM, aMc, resM);
      }
      uint64_t *ctx_n0 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n0, k1.mu, aMc, aMc);
    }
  }
  else
  {
    uint32_t bLen;
    if (bBits == 0U)
    {
      bLen = 1U;
    }
    else
    {
      bLen = (bBits - 1U) / 64U + 1U;
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1 + len1);
    uint64_t ctx[len1 + len1];
    memset(ctx, 0U, (len1 + len1) * sizeof (uint64_t));
    memcpy(ctx, k1.n, len1 * sizeof (uint64_t));
    memcpy(ctx + len1, k1.r2, len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), 16U * len1);
    uint64_t table[16U * len1];
    memset(table, 0U, 16U * len1 * sizeof (uint64_t));
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp[len1];
    memset(tmp, 0U, len1 * sizeof (uint64_t));
    uint64_t *t0 = table;
    uint64_t *t1 = table + len1;
    uint64_t *ctx_n0 = ctx;
    uint64_t *ctx_r20 = ctx + len1;
    Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n0, k1.mu, ctx_r20, t0);
    memcpy(t1, aMc, len1 * sizeof (uint64_t));
    KRML_MAYBE_FOR7(i,
      0U,
      7U,
      1U,
      uint64_t *t11 = table + (i + 1U) * len1;
      uint64_t *ctx_n1 = ctx;
      Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n1, k1.mu, t11, tmp);
      memcpy(table + (2U * i + 2U) * len1, tmp, len1 * sizeof (uint64_t));
      uint64_t *t2 = table + (2U * i + 2U) * len1;
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, aMc, t2, tmp);
      memcpy(table + (2U * i + 3U) * len1, tmp, len1 * sizeof (uint64_t)););
    if (bBits % 4U != 0U)
    {
      uint32_t i = bBits / 4U * 4U;
      uint64_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, i, 4U);
      uint32_t bits_l32 = (uint32_t)bits_c;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(resM, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
    }
    else
    {
      uint64_t *ctx_n = ctx;
      uint64_t *ctx_r2 = ctx + len1;
      Hacl_Bignum_Montgomery_bn_from_mont_u64(len1, ctx_n, k1.mu, ctx_r2, resM);
    }
    KRML_CHECK_SIZE(sizeof (uint64_t), len1);
    uint64_t tmp0[len1];
    memset(tmp0, 0U, len1 * sizeof (uint64_t));
    for (uint32_t i = 0U; i < bBits / 4U; i++)
    {
      KRML_MAYBE_FOR4(i0,
        0U,
        4U,
        1U,
        uint64_t *ctx_n = ctx;
        Hacl_Bignum_Montgomery_bn_mont_sqr_u64(len1, ctx_n, k1.mu, resM, resM););
      uint32_t k2 = bBits - bBits % 4U - 4U * i - 4U;
      uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(bLen, b, k2, 4U);
      uint32_t bits_l32 = (uint32_t)bits_l;
      const uint64_t *a_bits_l = table + bits_l32 * len1;
      memcpy(tmp0, (uint64_t *)a_bits_l, len1 * sizeof (uint64_t));
      uint64_t *ctx_n = ctx;
      Hacl_Bignum_Montgomery_bn_mont_mul_u64(len1, ctx_n, k1.mu, resM, tmp0, resM);
    }
  }
}